

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O2

void __thiscall CPT::SanityCheck(CPT *this)

{
  size_type sVar1;
  size_type sVar2;
  ostream *poVar3;
  double *pdVar4;
  size_type sVar5;
  size_t y;
  size_type sVar6;
  long lVar7;
  bool bVar8;
  double p1;
  
  sVar1 = (this->_m_probTable).size1_;
  sVar2 = (this->_m_probTable).size2_;
  lVar7 = 0;
  for (sVar6 = 0; sVar6 != sVar2; sVar6 = sVar6 + 1) {
    p1 = 0.0;
    pdVar4 = (double *)((long)(this->_m_probTable).data_.data_ + lVar7);
    sVar5 = sVar1;
    while (bVar8 = sVar5 != 0, sVar5 = sVar5 - 1, bVar8) {
      p1 = p1 + *pdVar4;
      pdVar4 = pdVar4 + (this->_m_probTable).size2_;
    }
    bVar8 = Globals::EqualProbability(p1,1.0);
    if (!bVar8) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Warning! CPT::SanityCheck for y=");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," doesn\'t sum to 1.0!");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    lVar7 = lVar7 + 8;
  }
  return;
}

Assistant:

void CPT::SanityCheck() const
{
    //cout << "Starting CPT::SanityCheck()"<<endl;
    size_t X = _m_probTable.size1();
    size_t Y = _m_probTable.size2();
    for(size_t y=0; y < Y; y++) 
    {
        double psum = 0.0;
        for(size_t x=0; x < X; x++) 
            psum += _m_probTable(x,y);
        if (! Globals::EqualProbability( psum, 1.0 ) )
            cerr << "Warning! CPT::SanityCheck for y="<<y<< 
                " doesn't sum to 1.0!" << endl;
    }

}